

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

type cm::operator>=(String *l,char (*r) [2])

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  sVar1 = (l->view_)._M_len;
  if (sVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = memcmp((l->view_)._M_str,r,(ulong)(sVar1 != 0));
    uVar3 = (ulong)uVar2;
  }
  if ((int)uVar3 == 0) {
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)(sVar1 - 1)) {
      uVar3 = sVar1 - 1;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0x7fffffff;
    }
  }
  return -1 < (int)uVar3;
}

Assistant:

string_view view() const noexcept { return this->view_; }